

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessage
          (LogMessage *this,Nonnull<const_char_*> file,int line,LogSeverity severity)

{
  LogMessageData *pLVar1;
  undefined1 local_38 [16];
  Duration local_28;
  
  local_38._0_4_ = severity;
  local_38._4_4_ = line;
  local_38._8_8_ = file;
  base_internal::ErrnoSaver::ErrnoSaver(&this->errno_saver_);
  local_28 = (Duration)Now();
  std::
  make_unique<absl::lts_20250127::log_internal::LogMessage::LogMessageData,char_const*&,int&,absl::lts_20250127::LogSeverity&,absl::lts_20250127::Time>
            ((char **)&this->data_,(int *)(local_38 + 8),(LogSeverity *)(local_38 + 4),
             (Time *)local_38);
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  pLVar1->first_fatal = false;
  pLVar1->fail_quietly = false;
  pLVar1->is_perror = false;
  LogBacktraceIfNeeded(this);
  return;
}

Assistant:

LogMessage::LogMessage(absl::Nonnull<const char*> file, int line,
                       absl::LogSeverity severity)
    : data_(absl::make_unique<LogMessageData>(file, line, severity,
                                              absl::Now())) {
  data_->first_fatal = false;
  data_->is_perror = false;
  data_->fail_quietly = false;

  // This logs a backtrace even if the location is subsequently changed using
  // AtLocation.  This quirk, and the behavior when AtLocation is called twice,
  // are fixable but probably not worth fixing.
  LogBacktraceIfNeeded();
}